

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

I32 Omega_h::binary::read_version(path *path,CommPtr *comm)

{
  char cVar1;
  I32 IVar2;
  value_type *pvVar3;
  I32 version;
  path filepath;
  ifstream file;
  byte abStack_200 [488];
  
  IVar2 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (IVar2 == 0) {
    filesystem::path::path((path *)&file,"version");
    filesystem::operator/(&filepath,path,(path *)&file);
    std::__cxx11::string::~string((string *)&file);
    pvVar3 = filesystem::path::c_str(&filepath);
    std::ifstream::ifstream(&file,pvVar3,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      version = -1;
    }
    else {
      std::istream::operator>>((istream *)&file,&version);
      if ((abStack_200[*(long *)(_file + -0x18)] & 5) != 0) {
        pvVar3 = filesystem::path::c_str(&filepath);
        fail("could not read file \"%s\"\n",pvVar3);
      }
    }
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&filepath);
  }
  Comm::bcast<int>((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   &version,0);
  return version;
}

Assistant:

I32 read_version(filesystem::path const& path, CommPtr comm) {
  I32 version;
  if (comm->rank() == 0) {
    auto const filepath = path / "version";
    std::ifstream file(filepath.c_str());
    if (!file.is_open()) {
      version = -1;
    } else {
      file >> version;
      if (!file) {
        Omega_h_fail("could not read file \"%s\"\n", filepath.c_str());
      }
    }
  }
  comm->bcast(version);
  return version;
}